

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

bool deqp::gls::anon_unknown_1::hasAttributeAliasing
               (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                *attributes,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *bindings)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer pAVar4;
  const_iterator cVar5;
  ulong uVar6;
  ulong uVar7;
  _Rb_tree_color _Var8;
  _Rb_tree_color _Var9;
  bool bVar10;
  long lVar11;
  vector<bool,_std::allocator<bool>_> local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_68;
  _Base_ptr local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  
  bVar10 = false;
  local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pAVar4 = (attributes->
           super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(attributes->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) >> 7)) {
    local_60 = &(bindings->_M_t)._M_impl.super__Rb_tree_header._M_header;
    lVar11 = 0;
    local_68 = &bindings->_M_t;
    do {
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(local_68,&pAVar4[lVar11].m_name);
      if (cVar5._M_node == local_60) {
        _Var8 = ~_S_red;
      }
      else {
        _Var8 = cVar5._M_node[2]._M_color;
      }
      pAVar4 = (attributes->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar1 = *(long *)&pAVar4[lVar11].m_type.m_name._M_dataplus;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,lVar1,pAVar4[lVar11].m_type.m_name._M_string_length + lVar1);
      uVar2._0_4_ = pAVar4[lVar11].m_type.m_locationSize;
      uVar2._4_4_ = pAVar4[lVar11].m_type.m_glTypeEnum;
      local_38 = uVar2;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if (_Var8 != ~_S_red) {
        if ((ulong)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <
            (ulong)((undefined4)uVar2 + _Var8)) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    (&local_90,(ulong)((undefined4)uVar2 + _Var8),false);
        }
        if (0 < (int)(undefined4)uVar2) {
          uVar7 = (ulong)((undefined4)uVar2 & 0x7fffffff);
          do {
            _Var9 = _Var8 + 0x3f;
            if (-1 < (int)_Var8) {
              _Var9 = _Var8;
            }
            uVar6 = (ulong)(((long)(int)_Var8 & 0x800000000000003fU) < 0x8000000000000001);
            if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)((int)_Var9 >> 6) + (uVar6 - 1)] >> ((long)(int)_Var8 & 0x3fU) & 1) != 0) {
              bVar3 = true;
              goto LAB_004c21c6;
            }
            local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[(long)((int)_Var9 >> 6) + (uVar6 - 1)] =
                 local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)((int)_Var9 >> 6) + (uVar6 - 1)] | 1L << ((byte)_Var8 & 0x3f);
            _Var8 = _Var8 + _S_black;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
      }
      lVar11 = lVar11 + 1;
      pAVar4 = (attributes->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(attributes->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4
                                   ) >> 7));
    bVar10 = false;
    bVar3 = false;
    if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
LAB_004c21c6:
      bVar10 = bVar3;
      operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return bVar10;
}

Assistant:

bool hasAttributeAliasing (const vector<Attribute>& attributes, const map<string, deUint32>& bindings)
{
	vector<bool> reservedSpaces;

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		const deInt32	location	= getBoundLocation(bindings, attributes[attribNdx].getName());
		const deUint32	size		= attributes[attribNdx].getType().getLocationSize();

		if (location != Attribute::LOC_UNDEF)
		{
			if (reservedSpaces.size() < location + size)
				reservedSpaces.resize(location + size, false);

			for (int i = 0; i < (int)size; i++)
			{
				if (reservedSpaces[location + i])
					return true;

				reservedSpaces[location + i] = true;
			}
		}
	}

	return false;
}